

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O0

void SHA384_512Finalize(SHA512Context *context,uint8_t Pad_Byte)

{
  short local_14;
  int_least16_t i;
  uint8_t Pad_Byte_local;
  SHA512Context *context_local;
  
  SHA384_512PadMessage(context,Pad_Byte);
  for (local_14 = 0; local_14 < 0x80; local_14 = local_14 + 1) {
    context->Message_Block[local_14] = '\0';
  }
  context->Length_Low = 0;
  context->Length_High = 0;
  context->Computed = 1;
  return;
}

Assistant:

static void SHA384_512Finalize(SHA512Context *context,
    uint8_t Pad_Byte)
{
    int_least16_t i;
    SHA384_512PadMessage(context, Pad_Byte);
    /* message may be sensitive, clear it out */
    for (i = 0; i < SHA512_Message_Block_Size; ++i)
        context->Message_Block[i] = 0;
#ifdef USE_32BIT_ONLY    /* and clear length */
    context->Length[0] = context->Length[1] = 0;
    context->Length[2] = context->Length[3] = 0;
#else /* !USE_32BIT_ONLY */
    context->Length_Low = 0;
    context->Length_High = 0;
#endif /* USE_32BIT_ONLY */
    context->Computed = 1;
}